

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O3

Hop_Obj_t * Abc_RecToHop3(Hop_Man_t *pMan,If_Man_t *pIfMan,If_Cut_t *pCut,If_Obj_t *pIfObj)

{
  undefined1 *puVar1;
  uint uVar2;
  ulong *puVar3;
  Vec_Mem_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  Gia_Obj_t *pGVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  word *pwVar12;
  Vec_Int_t *pVVar13;
  int *piVar14;
  Hop_Obj_t *pHVar15;
  void **ppvVar16;
  void **ppvVar17;
  byte bVar18;
  Gia_Obj_t *pGVar19;
  If_Man_t *pIVar20;
  Gia_Man_t *p;
  ulong *puVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  word *tLimit;
  ulong *puVar28;
  Gia_Obj_t *pGVar29;
  long lVar30;
  uint uCanonPhase;
  int BestPo;
  char pCanonPerm [16];
  uint local_84;
  Gia_Man_t *local_80;
  Lms_Man_t *local_78;
  Hop_Man_t *local_70;
  undefined8 local_68;
  If_Man_t *local_60;
  If_Cut_t *local_58;
  int local_4c;
  char local_48 [24];
  If_Man_t *pIVar11;
  
  local_84 = 0;
  local_78 = s_pMan3;
  p = s_pMan3->pGia;
  local_4c = -1;
  local_70 = pMan;
  if (pIfMan->pPars->fCutMin != 1) {
    __assert_fail("pIfMan->pPars->fCutMin == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0x410,"Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)"
                 );
  }
  uVar27 = pCut->iCutFunc;
  if ((int)uVar27 < 0) {
    __assert_fail("pCut->iCutFunc >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                  ,0x1b8,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
  }
  uVar2 = *(uint *)&pCut->field_0x1c;
  uVar8 = uVar2 >> 0x18;
  pIVar11 = (If_Man_t *)(ulong)uVar8;
  puVar3 = pIfMan->puTempW;
  pVVar4 = pIfMan->vTtMem[(long)pIVar11];
  if (pVVar4 == (Vec_Mem_t *)0x0) {
    pwVar12 = (word *)0x0;
  }
  else {
    uVar9 = uVar27 >> 1;
    if (pVVar4->nEntries <= (int)uVar9) {
      __assert_fail("i >= 0 && i < p->nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
    }
    pwVar12 = pVVar4->ppPages[uVar9 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
              (ulong)(uVar9 & pVVar4->PageMask) * (long)pVVar4->nEntrySize;
  }
  uVar9 = pIfMan->nTruth6Words[(long)pIVar11];
  if ((uVar27 & 1) == 0) {
    if (0 < (int)uVar9) {
      uVar24 = 0;
      do {
        puVar3[uVar24] = pwVar12[uVar24];
        uVar24 = uVar24 + 1;
      } while (uVar9 != uVar24);
    }
  }
  else if (0 < (int)uVar9) {
    uVar24 = 0;
    do {
      puVar3[uVar24] = ~pwVar12[uVar24];
      uVar24 = uVar24 + 1;
    } while (uVar9 != uVar24);
  }
  uVar9 = uVar27 & 1;
  if (0xffffff < uVar2) {
    local_68 = (Gia_Obj_t *)(CONCAT44(local_68._4_4_,uVar27) & 0xffffffff00000001);
    iVar10 = uVar8 - 6;
    uVar9 = 1 << ((byte)iVar10 & 0x1f);
    uVar27 = uVar9;
    if ((int)uVar9 < 2) {
      uVar27 = 1;
    }
    pIVar20 = (If_Man_t *)0x0;
    uVar26 = 0;
LAB_002fa939:
    bVar7 = (byte)pIVar20;
    if (uVar2 < 0x7000000) {
      if ((s_Truths6Neg[(long)pIVar20] & (*puVar3 >> ((byte)(1 << (bVar7 & 0x1f)) & 0x3f) ^ *puVar3)
          ) != 0) {
        uVar26 = uVar26 | 1 << ((uint)pIVar20 & 0x1f);
      }
    }
    else if ((If_Man_t *)&DAT_00000005 < pIVar20) {
      if (iVar10 != 0x1f) {
        puVar1 = (undefined1 *)((long)&pIVar20[-1].pMemEntries + 2);
        bVar18 = (byte)puVar1;
        uVar22 = 1 << (bVar18 & 0x1f);
        iVar23 = 2 << (bVar18 & 0x1f);
        uVar24 = 1;
        if (1 < (int)uVar22) {
          uVar24 = (ulong)uVar22;
        }
        puVar28 = puVar3 + (int)uVar22;
        puVar21 = puVar3;
        do {
          if (puVar1 != (undefined1 *)0x1f) {
            uVar25 = 0;
            do {
              if (puVar21[uVar25] != puVar28[uVar25]) {
                uVar22 = 1 << (bVar7 & 0x1f);
                goto LAB_002faa12;
              }
              uVar25 = uVar25 + 1;
            } while (uVar24 != uVar25);
          }
          puVar21 = puVar21 + iVar23;
          puVar28 = puVar28 + iVar23;
        } while (puVar21 < puVar3 + (int)uVar9);
      }
    }
    else if (iVar10 != 0x1f) {
      uVar22 = 1 << (bVar7 & 0x1f);
      uVar24 = 0;
      do {
        if (((puVar3[uVar24] >> ((byte)uVar22 & 0x3f) ^ puVar3[uVar24]) &
            s_Truths6Neg[(long)pIVar20]) != 0) goto LAB_002faa12;
        uVar24 = uVar24 + 1;
      } while (uVar27 != uVar24);
    }
    goto LAB_002faa18;
  }
LAB_002faff1:
  pHVar15 = pMan->pConst1;
  uVar9 = uVar9 ^ 1;
LAB_002fb039:
  return (Hop_Obj_t *)((ulong)uVar9 ^ (ulong)pHVar15);
LAB_002faa12:
  uVar26 = uVar22 | uVar26;
LAB_002faa18:
  pIVar20 = (If_Man_t *)((long)&pIVar20->pName + 1);
  if (pIVar20 == pIVar11) goto code_r0x002faa26;
  goto LAB_002fa939;
code_r0x002faa26:
  uVar9 = (uint)local_68;
  if (uVar26 != 0) {
    local_80 = p;
    local_60 = pIfMan;
    local_58 = pCut;
    if ((int)uVar26 < 1) {
      __assert_fail("Supp > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x575,"int Abc_TtSuppIsMinBase(int)");
    }
    if ((uVar26 == 1) || ((uVar26 + 1 & uVar26) != 0)) {
      if ((uVar26 & uVar26 - 1) != 0) {
        __assert_fail("Abc_TtSuppOnlyOne(uSupport)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x418,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      uVar27 = 0;
      do {
        if ((uVar26 >> (uVar27 & 0x1f) & 1) != 0) goto LAB_002fb020;
        uVar27 = uVar27 + 1;
      } while (uVar27 != 0x20);
      uVar27 = 0xffffffff;
LAB_002fb020:
      pHVar15 = Hop_IthVar(pMan,uVar27);
      uVar9 = pCut->iCutFunc;
      if ((int)uVar9 < 0) {
        __assert_fail("pCut->iCutFunc >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                      ,0x1b5,"int If_CutTruthIsCompl(If_Cut_t *)");
      }
    }
    else {
      uVar27 = (uVar26 >> 1 & 0x15555555) + (uVar26 & 0x55555555);
      uVar27 = (uVar27 >> 2 & 0x13333333) + (uVar27 & 0x33333333);
      uVar27 = (uVar27 >> 4 & 0x7070707) + (uVar27 & 0x7070707);
      uVar27 = (uVar27 >> 8 & 0xf000f) + (uVar27 & 0xf000f);
      if ((uVar27 >> 0x10) + (uVar27 & 0xffff) != uVar8) {
        __assert_fail("Gia_WordCountOnes(uSupport) == nLeaves",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x41b,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      If_CutFindBestStruct(pIfMan,pCut,local_48,&local_84,&local_4c);
      if ((long)local_4c < 0) {
        __assert_fail("BestPo >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x41f,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      if (p->vCos->nSize <= local_4c) {
LAB_002fb06f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar10 = p->vCos->pArray[local_4c];
      if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) {
LAB_002fb08e:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar29 = p->pObjs + iVar10;
      if (p->vTtNodes == (Vec_Int_t *)0x0) {
        pVVar13 = (Vec_Int_t *)malloc(0x10);
        pVVar13->nCap = 0x100;
        pVVar13->nSize = 0;
        piVar14 = (int *)malloc(0x400);
        pVVar13->pArray = piVar14;
        local_80->vTtNodes = pVVar13;
        p = local_80;
      }
      if (((int)(uint)*(undefined8 *)(pGVar29 + -(*(ulong *)pGVar29 & 0x1fffffff)) < 0) ||
         (((uint)*(undefined8 *)(pGVar29 + -(*(ulong *)pGVar29 & 0x1fffffff)) & 0x1fffffff) ==
          0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd( Gia_ObjFanin0(pGiaPo) )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x424,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      Gia_ObjCollectInternal(p,pGVar29 + -(*(ulong *)pGVar29 & 0x1fffffff));
      if (p->vTtNodes->nSize < 1) {
        __assert_fail("Vec_IntSize(pGia->vTtNodes) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x426,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      local_78->vLabelsP->nSize = 0;
      local_58 = (If_Cut_t *)CONCAT44(local_58._4_4_,local_84);
      pIVar20 = (If_Man_t *)0x0;
      local_68 = pGVar29;
      local_60 = pIVar11;
      do {
        pVVar5 = local_78->vLabelsP;
        pHVar15 = Hop_IthVar(local_70,(int)local_48[(long)pIVar20]);
        uVar9 = (uint)local_58 >> ((uint)pIVar20 & 0x1f);
        uVar27 = pVVar5->nSize;
        if (uVar27 == pVVar5->nCap) {
          if ((int)uVar27 < 0x10) {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar16 = (void **)malloc(0x80);
            }
            else {
              ppvVar16 = (void **)realloc(pVVar5->pArray,0x80);
            }
            pVVar5->pArray = ppvVar16;
            pVVar5->nCap = 0x10;
          }
          else {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar16 = (void **)malloc((ulong)uVar27 << 4);
            }
            else {
              ppvVar16 = (void **)realloc(pVVar5->pArray,(ulong)uVar27 << 4);
            }
            pVVar5->pArray = ppvVar16;
            pVVar5->nCap = uVar27 * 2;
          }
        }
        else {
          ppvVar16 = pVVar5->pArray;
        }
        iVar10 = pVVar5->nSize;
        pVVar5->nSize = iVar10 + 1;
        ppvVar16[iVar10] = (void *)((ulong)((uVar9 & 1) != 0) ^ (ulong)pHVar15);
        pIVar20 = (If_Man_t *)((long)&pIVar20->pName + 1);
      } while (local_60 != pIVar20);
      pVVar13 = local_80->vTtNodes;
      lVar30 = 0;
      do {
        iVar10 = pVVar13->pArray[lVar30];
        if (((long)iVar10 < 0) || (local_80->nObjs <= iVar10)) goto LAB_002fb08e;
        pGVar29 = local_80->pObjs + iVar10;
        uVar24 = *(ulong *)pGVar29;
        *(ulong *)pGVar29 = uVar24 & 0xffffffffbfffffff;
        uVar25 = (ulong)((uint)uVar24 & 0x1fffffff);
        uVar27 = (uint)*(undefined8 *)(pGVar29 + -uVar25);
        pVVar5 = local_78->vLabelsP;
        if ((~uVar27 & 0x1fffffff) == 0 || (int)uVar27 < 0) {
          if (-1 < (int)uVar27) goto LAB_002fb0cc;
          uVar27 = (uint)((ulong)*(undefined8 *)(pGVar29 + -uVar25) >> 0x20);
          uVar9 = pVVar5->nSize;
          if ((int)uVar9 <= (int)(uVar27 & 0x1fffffff)) goto LAB_002fb050;
          ppvVar17 = pVVar5->pArray;
          ppvVar16 = (void **)((ulong)(uVar27 << 3) + (long)ppvVar17);
        }
        else {
          pGVar19 = pGVar29 + -uVar25;
          pGVar6 = local_80->pObjs;
          if ((pGVar19 < pGVar6) || (pGVar6 + local_80->nObjs <= pGVar19)) goto LAB_002fb0ad;
          uVar27 = (int)((long)pGVar19 - (long)pGVar6 >> 2) * -0x55555555;
          if (((int)uVar27 < 0) || (local_80->vTtNums->nSize <= (int)uVar27)) goto LAB_002fb06f;
          uVar27 = local_80->vTtNums->pArray[uVar27 & 0x7fffffff] + uVar8;
          if (((int)uVar27 < 0) || (uVar9 = pVVar5->nSize, (int)uVar9 <= (int)uVar27))
          goto LAB_002fb050;
          ppvVar17 = pVVar5->pArray;
          ppvVar16 = ppvVar17 + uVar27;
        }
        uVar27 = (uint)(uVar24 >> 0x20);
        uVar25 = (ulong)(uVar27 & 0x1fffffff);
        uVar26 = (uint)*(undefined8 *)(pGVar29 + -uVar25);
        if ((~uVar26 & 0x1fffffff) == 0 || (int)uVar26 < 0) {
          if (-1 < (int)uVar26) {
LAB_002fb0cc:
            __assert_fail("pObj->fTerm",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
          }
          uVar26 = (uint)((ulong)*(undefined8 *)(pGVar29 + -uVar25) >> 0x20);
          if (uVar9 <= (uVar26 & 0x1fffffff)) goto LAB_002fb050;
          uVar26 = uVar26 & 0x1fffffff;
        }
        else {
          pGVar19 = pGVar29 + -uVar25;
          pGVar6 = local_80->pObjs;
          if ((pGVar19 < pGVar6) || (pGVar6 + local_80->nObjs <= pGVar19)) goto LAB_002fb0ad;
          uVar26 = (int)((long)pGVar19 - (long)pGVar6 >> 2) * -0x55555555;
          if (((int)uVar26 < 0) || (local_80->vTtNums->nSize <= (int)uVar26)) goto LAB_002fb06f;
          uVar26 = local_80->vTtNums->pArray[uVar26 & 0x7fffffff] + uVar8;
          if (((int)uVar26 < 0) || (uVar9 <= uVar26)) goto LAB_002fb050;
        }
        pHVar15 = Hop_And(local_70,(Hop_Obj_t *)
                                   ((ulong)((uint)(uVar24 >> 0x1d) & 1) ^ (ulong)*ppvVar16),
                          (Hop_Obj_t *)((ulong)(uVar27 >> 0x1d & 1) ^ (ulong)ppvVar17[uVar26]));
        pVVar5 = local_78->vLabelsP;
        uVar27 = pVVar5->nSize;
        if (uVar27 == pVVar5->nCap) {
          if ((int)uVar27 < 0x10) {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar16 = (void **)malloc(0x80);
            }
            else {
              ppvVar16 = (void **)realloc(pVVar5->pArray,0x80);
            }
            pVVar5->pArray = ppvVar16;
            pVVar5->nCap = 0x10;
          }
          else {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar16 = (void **)malloc((ulong)uVar27 << 4);
            }
            else {
              ppvVar16 = (void **)realloc(pVVar5->pArray,(ulong)uVar27 << 4);
            }
            pVVar5->pArray = ppvVar16;
            pVVar5->nCap = uVar27 * 2;
          }
        }
        else {
          ppvVar16 = pVVar5->pArray;
        }
        iVar10 = pVVar5->nSize;
        pVVar5->nSize = iVar10 + 1;
        ppvVar16[iVar10] = pHVar15;
        lVar30 = lVar30 + 1;
        pVVar13 = local_80->vTtNodes;
      } while (lVar30 < pVVar13->nSize);
      if (((int)(uint)*(ulong *)pGVar29 < 0) ||
         (((uint)*(ulong *)pGVar29 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pGiaTemp)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x440,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      pGVar6 = local_80->pObjs;
      if ((pGVar29 < pGVar6) || (pGVar6 + local_80->nObjs <= pGVar29)) {
LAB_002fb0ad:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar27 = (int)((long)pGVar29 - (long)pGVar6 >> 2) * -0x55555555;
      if (((int)uVar27 < 0) || (local_80->vTtNums->nSize <= (int)uVar27)) goto LAB_002fb06f;
      uVar8 = local_80->vTtNums->pArray[uVar27 & 0x7fffffff] + uVar8;
      if (((int)uVar8 < 0) || (local_78->vLabelsP->nSize <= (int)uVar8)) {
LAB_002fb050:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pHVar15 = (Hop_Obj_t *)local_78->vLabelsP->pArray[uVar8];
      uVar9 = local_84 >> ((byte)(uVar2 >> 0x18) & 0x1f) ^ *(uint *)local_68 >> 0x1d;
    }
    uVar9 = uVar9 & 1;
    goto LAB_002fb039;
  }
  goto LAB_002faff1;
}

Assistant:

Hop_Obj_t * Abc_RecToHop3( Hop_Man_t * pMan, If_Man_t * pIfMan, If_Cut_t * pCut, If_Obj_t * pIfObj )
{
    Lms_Man_t * p = s_pMan3;
    char pCanonPerm[LMS_VAR_MAX];
    unsigned uCanonPhase = 0;
    Hop_Obj_t * pFan0, * pFan1, * pHopObj;
    Gia_Man_t * pGia = p->pGia;
    Gia_Obj_t * pGiaPo, * pGiaTemp = NULL;
    int i, uSupport, BestPo = -1, nLeaves = If_CutLeaveNum(pCut);
    assert( pIfMan->pPars->fCutMin == 1 );

    // compute support
    uSupport = Abc_TtSupport( If_CutTruthW(pIfMan, pCut), nLeaves );
    if ( uSupport == 0 )
        return Hop_NotCond( Hop_ManConst0(pMan), If_CutTruthIsCompl(pCut) );
    if ( !Abc_TtSuppIsMinBase(uSupport) || uSupport == 1 )
    {
        assert( Abc_TtSuppOnlyOne(uSupport) );
        return Hop_NotCond( Hop_IthVar(pMan, Abc_TtSuppFindFirst(uSupport)), If_CutTruthIsCompl(pCut) );
    }
    assert( Gia_WordCountOnes(uSupport) == nLeaves );

    // get the best output for this node
    If_CutFindBestStruct( pIfMan, pCut, pCanonPerm, &uCanonPhase, &BestPo );
    assert( BestPo >= 0 );
    pGiaPo = Gia_ManCo( pGia, BestPo );
    // collect internal nodes into pGia->vTtNodes
    if ( pGia->vTtNodes == NULL )
        pGia->vTtNodes = Vec_IntAlloc( 256 );
    assert( Gia_ObjIsAnd( Gia_ObjFanin0(pGiaPo) ) );
    Gia_ObjCollectInternal( pGia, Gia_ObjFanin0(pGiaPo) );
    assert( Vec_IntSize(pGia->vTtNodes) > 0 );

    // collect HOP nodes for leaves
    Vec_PtrClear( p->vLabelsP );
    for ( i = 0; i < nLeaves; i++ )
        Vec_PtrPush( p->vLabelsP, Hop_NotCond(Hop_IthVar(pMan, pCanonPerm[i]), (uCanonPhase >> i) & 1) );

    // compute HOP nodes for internal nodes
    Gia_ManForEachObjVec( pGia->vTtNodes, pGia, pGiaTemp, i )
    {
        pGiaTemp->fMark0 = 0; // unmark node marked by Gia_ObjCollectInternal()
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pGiaTemp)) )
            pFan0 = (Hop_Obj_t *)Vec_PtrEntry(p->vLabelsP, Gia_ObjNum(pGia, Gia_ObjFanin0(pGiaTemp)) + nLeaves);
        else
            pFan0 = (Hop_Obj_t *)Vec_PtrEntry(p->vLabelsP, Gia_ObjCioId(Gia_ObjFanin0(pGiaTemp)));
        pFan0 = Hop_NotCond(pFan0, Gia_ObjFaninC0(pGiaTemp));
        if ( Gia_ObjIsAnd(Gia_ObjFanin1(pGiaTemp)) )
            pFan1 = (Hop_Obj_t *)Vec_PtrEntry(p->vLabelsP, Gia_ObjNum(pGia, Gia_ObjFanin1(pGiaTemp)) + nLeaves);
        else
            pFan1 = (Hop_Obj_t *)Vec_PtrEntry(p->vLabelsP, Gia_ObjCioId(Gia_ObjFanin1(pGiaTemp)));
        pFan1 = Hop_NotCond(pFan1, Gia_ObjFaninC1(pGiaTemp));

        pHopObj = Hop_And(pMan, pFan0, pFan1);
        Vec_PtrPush(p->vLabelsP, pHopObj);
    }
    // get the final result
    assert( Gia_ObjIsAnd(pGiaTemp) );
    pHopObj = (Hop_Obj_t *)Vec_PtrEntry(p->vLabelsP, Gia_ObjNum(pGia, pGiaTemp) + nLeaves);
    // complement the result if needed
    return Hop_NotCond( pHopObj,  Gia_ObjFaninC0(pGiaPo) ^ ((uCanonPhase >> nLeaves) & 1) );    
}